

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::IsnanCase::compare(IsnanCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  uint uVar3;
  ulong uVar4;
  ostream *poVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (PVar1 == PRECISION_HIGHP) {
    uVar7 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar7;
    }
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      uVar3 = *(uint *)((long)*inputs + uVar7 * 4);
      bVar8 = (~uVar3 & 0x7f800000) == 0;
      bVar9 = (uVar3 & 0x7fffff) != 0;
      if ((*(int *)((long)*outputs + uVar7 * 4) == 0) == (bVar9 && bVar8)) {
        poVar5 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar7);
        poVar5 = std::operator<<(poVar5,"] = ");
        pcVar6 = "false";
        if (bVar9 && bVar8) {
          pcVar6 = "true";
        }
LAB_004757bc:
        std::operator<<(poVar5,pcVar6);
        return false;
      }
    }
  }
  else if (PVar1 < PRECISION_HIGHP) {
    uVar7 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar7;
    }
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      uVar3 = *(uint *)((long)*inputs + uVar7 * 4);
      if (((~uVar3 & 0x7f800000) != 0 || (uVar3 & 0x7fffff) == 0) &&
         (*(int *)((long)*outputs + uVar7 * 4) != 0)) {
        poVar5 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar7);
        poVar5 = std::operator<<(poVar5,"] = ");
        pcVar6 = "false";
        goto LAB_004757bc;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isNaN();

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}
		else if (precision == glu::PRECISION_MEDIUMP || precision == glu::PRECISION_LOWP)
		{
			// NaN support is optional, check that inputs that are not NaN don't result in true.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isNaN();

				if (!ref && out0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}

		return true;
	}